

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void __thiscall Cart::Cart(Cart *this,Buffer *rom,Variant variant)

{
  uchar x;
  pointer puVar1;
  pointer puVar2;
  CGB CVar3;
  runtime_error *this_00;
  byte bVar4;
  long lVar5;
  undefined8 *puVar6;
  pointer *ppuVar7;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_char> __l_00;
  allocator_type local_89;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70 [3];
  
  puVar1 = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = &DAT_0010cae8;
  ppuVar7 = (pointer *)local_70;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *ppuVar7 = (pointer)*puVar6;
    puVar6 = puVar6 + 1;
    ppuVar7 = ppuVar7 + 1;
  }
  __l._M_len = 9;
  __l._M_array = (iterator)local_70;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,__l,&local_89);
  ThrowUnlessContains<unsigned_long>
            ((long)puVar2 - (long)puVar1,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,"Invalid ROM size.")
  ;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_88);
  x = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[0x143];
  local_88._M_impl.super__Vector_impl_data._M_start._0_2_ = 0x8000;
  local_88._M_impl.super__Vector_impl_data._M_start._2_1_ = 0xc0;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,__l_00,
             (allocator_type *)&local_89);
  ThrowUnlessContains<unsigned_char>
            (x,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,"Invalid cgb flag."
            );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(local_70);
  CVar3 = (CGB)(rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start[0x143];
  this->cgb = CVar3;
  ThrowUnless((variant == Guess || variant == CGB) || CVar3 != Required,"Variant requires CGB.");
  puVar1 = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar4 = puVar1[0x147] + 4;
  if ((0x22 < bVar4) || ((0x7e0fdb6ffU >> ((ulong)bVar4 & 0x3f) & 1) == 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid cart type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->mbc = *(MBC *)(&DAT_0010d190 + (ulong)bVar4 * 4);
  ThrowUnless(puVar1[0x148] < 9,"Invalid ROM size.");
  puVar1 = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar4 = puVar1[0x148];
  this->rom_size = (uint)bVar4;
  this->rom_bank_mask = (char)(2 << (bVar4 & 0x1f)) + 0xff;
  ThrowUnless(puVar1[0x149] < 6,"Invalid SRAM size.");
  bVar4 = (rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[0x149];
  this->sram_size = (uint)bVar4;
  if (this->mbc == _2) {
    this->sram_bank_mask = '\0';
    this->sram_addr_mask = 0x1ff;
    return;
  }
  switch(bVar4) {
  case 0:
    this->sram_addr_mask = 0;
    this->sram_bank_mask = '\0';
    return;
  case 1:
    this->sram_bank_mask = '\0';
    this->sram_addr_mask = 0x7ff;
    return;
  case 2:
    this->sram_bank_mask = '\0';
    break;
  case 3:
    this->sram_bank_mask = '\x03';
    break;
  case 4:
    this->sram_bank_mask = '\x0f';
    break;
  case 5:
    this->sram_bank_mask = '\a';
    break;
  default:
    goto switchD_001065d9_default;
  }
  this->sram_addr_mask = 0x1fff;
switchD_001065d9_default:
  return;
}

Assistant:

Cart::Cart(const Buffer& rom, Variant variant) {
  ThrowUnlessContains(rom.size(),
                      {1u << 15, 1u << 16, 1u << 17, 1u << 18, 1u << 19,
                       1u << 20, 1u << 21, 1u << 22, 1u << 23},
                      "Invalid ROM size.");

  ThrowUnlessContains(rom[0x143], {0, 0x80, 0xc0}, "Invalid cgb flag.");
  cgb = static_cast<CGB>(rom[0x143]);

  ThrowUnless(cgb != CGB::Required || variant == Variant::CGB ||
                  variant == Variant::Guess,
              "Variant requires CGB.");

  switch (rom[0x147]) {
    case 0: case 8: case 9: case 252: mbc = MBC::None; break;
    case 1: case 2: case 3: mbc = MBC::_1; break;
    case 5: case 6: mbc = MBC::_2; break;
    case 11: case 12: case 14: mbc = MBC::MMM01; break;
    case 15: case 16: case 17: case 18: case 19: mbc = MBC::_3; break;
    case 25: case 26: case 27: case 28: case 29: case 30: mbc = MBC::_5; break;
    case 253: mbc = MBC::TAMA5; break;
    case 254: mbc = MBC::HUC3; break;
    case 255: mbc = MBC::HUC1; break;
    default: throw Error("Invalid cart type");
  }

  ThrowUnless(rom[0x148] <= 8, "Invalid ROM size.");
  rom_size = static_cast<ROMSize>(rom[0x148]);
  rom_bank_mask = (2 << (u8)rom_size) - 1;

  ThrowUnless(rom[0x149] <= 5, "Invalid SRAM size.");
  sram_size = static_cast<SRAMSize>(rom[0x149]);
  if (mbc == MBC::_2) {
    sram_bank_mask = 0;
    sram_addr_mask = 0x1ff;
  } else {
    switch (sram_size) {
      case SRAMSize::None: sram_bank_mask = sram_addr_mask = 0; break;
      case SRAMSize::_2k: sram_bank_mask = 0; sram_addr_mask = 0x7ff; break;
      case SRAMSize::_8k: sram_bank_mask = 0; sram_addr_mask = 0x1fff; break;
      case SRAMSize::_32k: sram_bank_mask = 3; sram_addr_mask = 0x1fff; break;
      case SRAMSize::_128k: sram_bank_mask = 15; sram_addr_mask = 0x1fff; break;
      case SRAMSize::_64k: sram_bank_mask = 7; sram_addr_mask = 0x1fff; break;
    }
  }
}